

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<capnp::compiler::Compiler::Node::Content_&> __thiscall
capnp::compiler::Compiler::Node::getContent(Node *this,State minimumState)

{
  Content *pCVar1;
  ulong uVar2;
  RemoveConst<capnp::compiler::Compiler::Node_*> **pppNVar3;
  CapTableReader **this_00;
  ushort uVar4;
  State SVar5;
  Module *pMVar6;
  Impl *pIVar7;
  Node **ppNVar8;
  CompiledModule *pCVar9;
  ArrayDisposer *pAVar10;
  Reader *pRVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  Node *this_01;
  Node **ppNVar16;
  Node *pNVar17;
  NodeTranslator *pNVar19;
  long *ptr;
  Exception *params_1;
  char *pcVar20;
  ElementCount EVar21;
  size_t sVar22;
  ulong uVar23;
  Reader *pRVar25;
  Arena *pAVar26;
  ElementCount index;
  Alias *ptrCopy;
  Node *ptrCopy_1;
  bool bVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  ArrayPtr<const_char> AVar32;
  Reader value;
  Fault f;
  undefined8 uStack_3d0;
  CapTableReader *local_3c8;
  Node *pNStack_3c0;
  StructDataBitCount local_3b8;
  StructPointerCount SStack_3b4;
  undefined2 uStack_3b2;
  ListElementCount LStack_3b0;
  undefined4 uStack_3ac;
  Builder nestedNodes;
  PointerReader local_358;
  _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>>
  *local_330;
  Vector<capnp::compiler::Compiler::Node_*> *local_328;
  _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>>
  *local_320;
  OrphanBuilder local_318;
  NodeSet nodeSet;
  Reader nestedDecl;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined1 local_140 [272];
  ulong uVar18;
  ulong uVar24;
  
  if (this->isBuiltin == true) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
              ((Fault *)&nodeSet,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
               ,0x1ce,FAILED,"!isBuiltin","\"illegal method call for built-in declaration\"",
               (char (*) [45])"illegal method call for built-in declaration");
    kj::_::Debug::Fault::fatal((Fault *)&nodeSet);
  }
  pCVar1 = &this->guardedContent;
  SVar5 = (this->guardedContent).state;
  if ((int)minimumState <= (int)SVar5) {
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)pCVar1;
  }
  if (this->inGetContent == true) {
    pMVar6 = this->module->parserModule;
    (**(pMVar6->super_ErrorReporter)._vptr_ErrorReporter)
              (pMVar6,(ulong)this->startByte,(ulong)this->endByte,
               "Declaration recursively depends on itself.",0x2b);
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)(Content *)0x0;
  }
  this->inGetContent = true;
  if (SVar5 != BOOTSTRAP) {
    if (SVar5 != EXPANDED) {
      if ((SVar5 != STUB) || ((int)minimumState < 1)) goto LAB_00154fb1;
      bVar27 = (this->declaration)._reader.pointerCount < 3;
      nestedDecl._reader.data = (this->declaration)._reader.pointers + 2;
      if (bVar27) {
        nestedDecl._reader.data = (WirePointer *)0x0;
      }
      nestedDecl._reader.pointers._0_4_ = (this->declaration)._reader.nestingLimit;
      if (bVar27) {
        nestedDecl._reader.segment._0_4_ = 0;
        nestedDecl._reader.segment._4_4_ = 0;
        uVar28 = 0;
        uVar30 = 0;
        nestedDecl._reader.pointers._0_4_ = 0x7fffffff;
      }
      else {
        nestedDecl._reader.segment._0_4_ = *(undefined4 *)&(this->declaration)._reader.segment;
        nestedDecl._reader.segment._4_4_ =
             *(undefined4 *)((long)&(this->declaration)._reader.segment + 4);
        uVar28 = *(undefined4 *)&(this->declaration)._reader.capTable;
        uVar30 = *(undefined4 *)((long)&(this->declaration)._reader.capTable + 4);
      }
      pIVar7 = this->module->compiler;
      nestedDecl._reader.capTable = (CapTableReader *)CONCAT44(uVar30,uVar28);
      _::PointerReader::getList
                ((ListReader *)&nodeSet,(PointerReader *)&nestedDecl,INLINE_COMPOSITE,(word *)0x0);
      EVar21 = (ElementCount)nodeSet.node._reader.pointers;
      if ((ElementCount)nodeSet.node._reader.pointers != 0) {
        pAVar26 = &pIVar7->nodeArena;
        local_330 = (_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>>
                     *)&(this->guardedContent).aliases;
        local_328 = &(this->guardedContent).orderedNestedNodes;
        local_320 = (_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>>
                     *)&(this->guardedContent).nestedNodes;
        index = 0;
        do {
          pNVar17 = (Node *)0x0;
          _::ListReader::getStructElement(&nestedDecl._reader,(ListReader *)&nodeSet,index);
          if (nestedDecl._reader.dataSize < 0x20) {
LAB_001546ce:
            this_01 = (Node *)kj::Arena::allocateBytes(pAVar26,0x1c0,8,false);
            Node(this_01,this,&nestedDecl);
            nestedNodes.builder.elementCount = nestedDecl._reader.nestingLimit;
            nestedNodes.builder.ptr =
                 (byte *)CONCAT44(nestedDecl._reader.pointers._4_4_,(int)nestedDecl._reader.pointers
                                 );
            if (nestedDecl._reader.pointerCount == 0) {
              nestedNodes.builder.elementCount = 0x7fffffff;
              nestedNodes.builder.ptr = (byte *)pNVar17;
            }
            nestedNodes.builder.segment._0_4_ = 0;
            nestedNodes.builder.segment._4_4_ = 0;
            nestedNodes.builder.capTable._0_4_ = 0;
            nestedNodes.builder.capTable._4_4_ = 0;
            if (nestedDecl._reader.pointerCount != 0) {
              nestedNodes.builder.segment._0_4_ = nestedDecl._reader.segment._0_4_;
              nestedNodes.builder.segment._4_4_ = nestedDecl._reader.segment._4_4_;
              nestedNodes.builder.capTable._0_4_ = nestedDecl._reader.capTable._0_4_;
              nestedNodes.builder.capTable._4_4_ = nestedDecl._reader.capTable._4_4_;
            }
            _::PointerReader::getStruct
                      ((StructReader *)&f,(PointerReader *)&nestedNodes,(word *)0x0);
            nestedNodes.builder.elementCount = LStack_3b0;
            nestedNodes.builder.ptr = (byte *)pNStack_3c0;
            if (SStack_3b4 == 0) {
              nestedNodes.builder.elementCount = 0x7fffffff;
              nestedNodes.builder.ptr = (byte *)pNVar17;
            }
            nestedNodes.builder.segment._0_4_ = 0;
            nestedNodes.builder.segment._4_4_ = 0;
            nestedNodes.builder.capTable._0_4_ = 0;
            nestedNodes.builder.capTable._4_4_ = 0;
            if (SStack_3b4 != 0) {
              nestedNodes.builder.segment._0_4_ = f.exception._0_4_;
              nestedNodes.builder.segment._4_4_ = f.exception._4_4_;
              nestedNodes.builder.capTable._0_4_ = (undefined4)uStack_3d0;
              nestedNodes.builder.capTable._4_4_ = uStack_3d0._4_4_;
            }
            AVar32 = (ArrayPtr<const_char>)
                     _::PointerReader::getBlob<capnp::Text>
                               ((PointerReader *)&nestedNodes,(void *)0x0,0);
            ppNVar16 = (this->guardedContent).orderedNestedNodes.builder.pos;
            if (ppNVar16 == (this->guardedContent).orderedNestedNodes.builder.endPtr) {
              ppNVar8 = (local_328->builder).ptr;
              sVar22 = (long)ppNVar16 - (long)ppNVar8 >> 2;
              if (ppNVar16 == ppNVar8) {
                sVar22 = 4;
              }
              kj::Vector<capnp::compiler::Compiler::Node_*>::setCapacity(local_328,sVar22);
              ppNVar16 = (this->guardedContent).orderedNestedNodes.builder.pos;
            }
            *ppNVar16 = this_01;
            pppNVar3 = &(this->guardedContent).orderedNestedNodes.builder.pos;
            *pppNVar3 = *pppNVar3 + 1;
            local_3c8 = (CapTableReader *)
                        &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Node>::instance;
            _f = AVar32;
            std::
            _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>>
            ::_M_emplace_equal<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Node>>>
                      (local_320,
                       (pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_> *)&f);
            pNStack_3c0 = this_01;
            if (this_01 != (Node *)0x0) {
              pNStack_3c0 = (Node *)0x0;
              (*(code *)*kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Node>::instance)
                        (&kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Node>::instance,
                         (_func_int *)
                         ((long)&(this_01->super_Resolver)._vptr_Resolver +
                         (long)(this_01->super_Resolver)._vptr_Resolver[-2]));
            }
          }
          else {
            uVar4 = *(ushort *)((long)nestedDecl._reader.data + 2);
            if (0xd < uVar4) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,char_const(&)[25],capnp::compiler::Declaration::Reader&>
                        (&f,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                         ,0x205,FAILED,(char *)0x0,"\"unknown declaration type\", nestedDecl",
                         (char (*) [25])"unknown declaration type",&nestedDecl);
              kj::_::Debug::Fault::fatal(&f);
            }
            if ((0x35d0U >> (uVar4 & 0x1f) & 1) == 0) {
              if ((0xa2dU >> (uVar4 & 0x1f) & 1) != 0) goto LAB_001546ce;
              nestedNodes.builder.ptr =
                   (byte *)(CONCAT44(nestedDecl._reader.pointers._4_4_,
                                     (int)nestedDecl._reader.pointers) + 0x28);
              if (nestedDecl._reader.pointerCount < 6) {
                nestedNodes.builder.segment._0_4_ = 0;
                nestedNodes.builder.segment._4_4_ = 0;
                nestedNodes.builder.capTable._0_4_ = 0;
                nestedNodes.builder.capTable._4_4_ = 0;
                nestedNodes.builder.elementCount = 0x7fffffff;
                nestedNodes.builder.ptr = (byte *)pNVar17;
              }
              else {
                nestedNodes.builder.segment._0_4_ = nestedDecl._reader.segment._0_4_;
                nestedNodes.builder.segment._4_4_ = nestedDecl._reader.segment._4_4_;
                nestedNodes.builder.capTable._0_4_ = nestedDecl._reader.capTable._0_4_;
                nestedNodes.builder.capTable._4_4_ = nestedDecl._reader.capTable._4_4_;
                nestedNodes.builder.elementCount = nestedDecl._reader.nestingLimit;
              }
              pCVar9 = this->module;
              _::PointerReader::getStruct
                        ((StructReader *)&f,(PointerReader *)&nestedNodes,(word *)0x0);
              pNVar17 = (Node *)kj::Arena::allocateBytes(pAVar26,0xd8,8,false);
              (pNVar17->super_Resolver)._vptr_Resolver = (_func_int **)pCVar9;
              pNVar17->module = (CompiledModule *)this;
              (pNVar17->parent).ptr = (Node *)f.exception;
              (pNVar17->declaration)._reader.segment = uStack_3d0;
              (pNVar17->declaration)._reader.capTable = local_3c8;
              (pNVar17->declaration)._reader.data = pNStack_3c0;
              (pNVar17->declaration)._reader.pointers =
                   (WirePointer *)CONCAT26(uStack_3b2,CONCAT24(SStack_3b4,local_3b8));
              (pNVar17->declaration)._reader.dataSize = LStack_3b0;
              (pNVar17->declaration)._reader.pointerCount = (short)uStack_3ac;
              *(short *)&(pNVar17->declaration)._reader.field_0x26 = SUB42(uStack_3ac,2);
              *(undefined1 *)&(pNVar17->declaration)._reader.nestingLimit = 0;
              (pNVar17->guardedContent).orderedNestedNodes.builder.ptr = (Node **)0x0;
              (pNVar17->guardedContent).orderedNestedNodes.builder.pos =
                   (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
              (pNVar17->guardedContent).orderedNestedNodes.builder.endPtr = (Node **)0x0;
              (pNVar17->guardedContent).orderedNestedNodes.builder.disposer = (ArrayDisposer *)0x0;
              *(undefined1 *)&(pNVar17->guardedContent).aliases._M_t._M_impl = 0;
              nestedNodes.builder.ptr =
                   (byte *)CONCAT44(nestedDecl._reader.pointers._4_4_,
                                    (int)nestedDecl._reader.pointers);
              if (nestedDecl._reader.pointerCount == 0) {
                nestedNodes.builder.segment._0_4_ = 0;
                nestedNodes.builder.segment._4_4_ = 0;
                nestedNodes.builder.capTable._0_4_ = 0;
                nestedNodes.builder.capTable._4_4_ = 0;
                nestedNodes.builder.elementCount = 0x7fffffff;
                nestedNodes.builder.ptr = (byte *)0x0;
              }
              else {
                nestedNodes.builder.segment._0_4_ = nestedDecl._reader.segment._0_4_;
                nestedNodes.builder.segment._4_4_ = nestedDecl._reader.segment._4_4_;
                nestedNodes.builder.capTable._0_4_ = nestedDecl._reader.capTable._0_4_;
                nestedNodes.builder.capTable._4_4_ = nestedDecl._reader.capTable._4_4_;
                nestedNodes.builder.elementCount = nestedDecl._reader.nestingLimit;
              }
              _::PointerReader::getStruct
                        ((StructReader *)&f,(PointerReader *)&nestedNodes,(word *)0x0);
              nestedNodes.builder.elementCount = LStack_3b0;
              nestedNodes.builder.ptr = (byte *)pNStack_3c0;
              if (SStack_3b4 == 0) {
                nestedNodes.builder.ptr = (byte *)0x0;
                nestedNodes.builder.elementCount = 0x7fffffff;
              }
              nestedNodes.builder.segment._0_4_ = 0;
              nestedNodes.builder.segment._4_4_ = 0;
              nestedNodes.builder.capTable._0_4_ = 0;
              nestedNodes.builder.capTable._4_4_ = 0;
              if (SStack_3b4 != 0) {
                nestedNodes.builder.segment._0_4_ = f.exception._0_4_;
                nestedNodes.builder.segment._4_4_ = f.exception._4_4_;
                nestedNodes.builder.capTable._0_4_ = (undefined4)uStack_3d0;
                nestedNodes.builder.capTable._4_4_ = uStack_3d0._4_4_;
              }
              _f = (ArrayPtr<const_char>)
                   _::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&nestedNodes,(void *)0x0,0);
              local_3c8 = (CapTableReader *)
                          &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::instance;
              std::
              _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>>
              ::_M_emplace_equal<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Alias>>>
                        (local_330,
                         (pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_> *)&f);
              pNStack_3c0 = pNVar17;
              if (pNVar17 != (Node *)0x0) {
                pNStack_3c0 = (Node *)0x0;
                kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::disposeImpl
                          ((DestructorOnlyDisposer<capnp::compiler::Compiler::Alias> *)
                           &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::instance,
                           pNVar17);
              }
            }
          }
          index = index + 1;
        } while (EVar21 != index);
      }
      pCVar1->state = EXPANDED;
    }
    if ((int)minimumState < 2) goto LAB_00154fb1;
    pIVar7 = this->module->compiler;
    _::OrphanBuilder::initStruct
              ((OrphanBuilder *)&nodeSet,(pIVar7->workspace).orphanage.arena,
               (pIVar7->workspace).orphanage.capTable,(StructSize)0x60005);
    local_318.segment = (SegmentBuilder *)nodeSet.node._reader.capTable;
    local_318.capTable = (CapTableBuilder *)nodeSet.node._reader.data;
    local_318.location = (word *)nodeSet.node._reader.pointers;
    local_318.tag.content = (uint64_t)nodeSet.node._reader.segment;
    _::OrphanBuilder::asStruct((StructBuilder *)&f,&local_318,(StructSize)0x60005);
    local_3c8->_vptr_CapTableReader = (_func_int **)this->id;
    nodeSet.node._reader.segment = (SegmentReader *)f.exception;
    nodeSet.node._reader.capTable = (CapTableReader *)uStack_3d0;
    nodeSet.node._reader.data = pNStack_3c0;
    _::PointerBuilder::setBlob<capnp::Text>
              ((PointerBuilder *)&nodeSet,(Reader)(this->displayName).content);
    pcVar20 = (this->displayName).content.ptr;
    uVar18 = (this->displayName).content.size_;
    uVar24 = uVar18 - 1;
    uVar23 = uVar18;
    do {
      if (uVar23 == 1) goto LAB_00154aa8;
      uVar2 = uVar23 - 1;
      lVar12 = uVar23 - 2;
      uVar23 = uVar2;
    } while (pcVar20[lVar12] != '.');
    *(int *)&local_3c8[1]._vptr_CapTableReader = (int)uVar2;
    pcVar20 = (this->displayName).content.ptr;
LAB_00154aa8:
    do {
      uVar23 = uVar24 - 1;
      if (uVar24 == 0) goto LAB_00154aca;
      uVar14 = (int)uVar18 - 1;
      uVar18 = (ulong)uVar14;
      lVar12 = uVar24 - 1;
      uVar24 = uVar23;
    } while (pcVar20[lVar12] != ':');
    if (*(uint *)&local_3c8[1]._vptr_CapTableReader < uVar23) {
      *(uint *)&local_3c8[1]._vptr_CapTableReader = uVar14;
    }
LAB_00154aca:
    pNVar17 = (this->parent).ptr;
    if (pNVar17 != (Node *)0x0) {
      local_3c8[2]._vptr_CapTableReader = (_func_int **)pNVar17->id;
    }
    nodeSet.node._reader.data = &pNStack_3c0->module;
    nodeSet.node._reader.segment = (SegmentReader *)f.exception;
    nodeSet.node._reader.capTable = (CapTableReader *)uStack_3d0;
    _::PointerBuilder::initStructList
              (&nestedNodes.builder,(PointerBuilder *)&nodeSet,
               (ElementCount)
               ((ulong)((long)(this->guardedContent).orderedNestedNodes.builder.pos -
                       (long)(this->guardedContent).orderedNestedNodes.builder.ptr) >> 3),
               (StructSize)0x10001);
    ppNVar16 = (this->guardedContent).orderedNestedNodes.builder.ptr;
    ppNVar8 = (this->guardedContent).orderedNestedNodes.builder.pos;
    if (ppNVar16 != ppNVar8) {
      EVar21 = 0;
      do {
        pNVar17 = *ppNVar16;
        _::ListBuilder::getStructElement((StructBuilder *)&nestedDecl,&nestedNodes.builder,EVar21);
        if ((pNVar17->declaration)._reader.pointerCount == 0) {
          uVar28 = 0;
          uVar30 = 0;
          uVar29 = 0;
          uVar31 = 0;
          local_358.nestingLimit = 0x7fffffff;
          local_358.pointer = (WirePointer *)0x0;
        }
        else {
          uVar28 = *(undefined4 *)&(pNVar17->declaration)._reader.segment;
          uVar30 = *(undefined4 *)((long)&(pNVar17->declaration)._reader.segment + 4);
          uVar29 = *(undefined4 *)&(pNVar17->declaration)._reader.capTable;
          uVar31 = *(undefined4 *)((long)&(pNVar17->declaration)._reader.capTable + 4);
          local_358.pointer = (pNVar17->declaration)._reader.pointers;
          local_358.nestingLimit = (pNVar17->declaration)._reader.nestingLimit;
        }
        local_358.segment = (SegmentReader *)CONCAT44(uVar30,uVar28);
        local_358.capTable = (CapTableReader *)CONCAT44(uVar31,uVar29);
        _::PointerReader::getStruct((StructReader *)&nodeSet,&local_358,(word *)0x0);
        bVar27 = nodeSet.node._reader.pointerCount == 0;
        local_358.pointer = nodeSet.node._reader.pointers;
        if (bVar27) {
          local_358.pointer = (WirePointer *)0x0;
        }
        local_358.nestingLimit = nodeSet.node._reader.nestingLimit;
        if (bVar27) {
          local_358.nestingLimit = 0x7fffffff;
        }
        uVar28 = 0;
        uVar30 = 0;
        uVar29 = 0;
        uVar31 = 0;
        if (!bVar27) {
          uVar28 = nodeSet.node._reader.segment._0_4_;
          uVar30 = nodeSet.node._reader.segment._4_4_;
          uVar29 = nodeSet.node._reader.capTable._0_4_;
          uVar31 = nodeSet.node._reader.capTable._4_4_;
        }
        local_358.segment = (SegmentReader *)CONCAT44(uVar30,uVar28);
        local_358.capTable = (CapTableReader *)CONCAT44(uVar31,uVar29);
        value = _::PointerReader::getBlob<capnp::Text>(&local_358,(void *)0x0,0);
        local_358.pointer =
             (WirePointer *)
             CONCAT44(nestedDecl._reader.pointers._4_4_,(int)nestedDecl._reader.pointers);
        local_358.segment =
             (SegmentReader *)
             CONCAT44(nestedDecl._reader.segment._4_4_,nestedDecl._reader.segment._0_4_);
        local_358.capTable = nestedDecl._reader.capTable;
        _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_358,value);
        _::ListBuilder::getStructElement((StructBuilder *)&nodeSet,&nestedNodes.builder,EVar21);
        *(uint64_t *)nodeSet.node._reader.data = pNVar17->id;
        EVar21 = EVar21 + 1;
        ppNVar16 = ppNVar16 + 1;
      } while (ppNVar16 != ppNVar8);
    }
    pAVar26 = &(pIVar7->workspace).arena;
    params_1 = (Exception *)&this->declaration;
    nodeSet.node._reader.segment =
         (SegmentReader *)
         CONCAT71(nodeSet.node._reader.segment._1_7_,
                  this->module->compiler->annotationFlag == COMPILE_ANNOTATIONS);
    pNVar19 = kj::Arena::
              allocate<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
                        (pAVar26,this,&this->module->parserModule->super_ErrorReporter,
                         (Reader *)params_1,(Orphan<capnp::schema::Node> *)&local_318,
                         (bool *)&nodeSet);
    (this->guardedContent).translator = pNVar19;
    local_358.segment = (SegmentReader *)&PTR_run_002060b0;
    local_358.capTable = (CapTableReader *)pCVar1;
    local_358.pointer = (WirePointer *)&pIVar7->workspace;
    kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&nestedDecl,(Runnable *)&local_358);
    nodeSet.node._reader.segment =
         (SegmentReader *)
         CONCAT71(nodeSet.node._reader.segment._1_7_,(byte)nestedDecl._reader.segment);
    bVar13 = (byte)nestedDecl._reader.segment;
    if ((byte)nestedDecl._reader.segment == 1) {
      nodeSet.node._reader.capTable = nestedDecl._reader.capTable;
      nodeSet.node._reader.pointers =
           (WirePointer *)
           CONCAT44(nestedDecl._reader.pointers._4_4_,(int)nestedDecl._reader.pointers);
      nodeSet.node._reader.data = nestedDecl._reader.data;
      nestedDecl._reader.capTable = (CapTableReader *)0x0;
      nestedDecl._reader.data = (void *)0x0;
      nodeSet.node._reader.pointerCount = nestedDecl._reader.pointerCount;
      nodeSet.node._reader.dataSize = nestedDecl._reader.dataSize;
      nodeSet.node._reader._38_2_ = nestedDecl._reader._38_2_;
      nodeSet.node._reader._44_4_ = nestedDecl._reader._44_4_;
      nodeSet.node._reader.nestingLimit = nestedDecl._reader.nestingLimit;
      nodeSet.auxNodes.ptr = (Reader *)local_168;
      nodeSet.auxNodes.size_ = uStack_160;
      nodeSet.auxNodes.disposer = (ArrayDisposer *)local_158;
      nodeSet.sourceInfo.ptr = (Reader *)uStack_150;
      nodeSet.sourceInfo.size_ = local_148;
      memcpy(&nodeSet.sourceInfo.disposer,local_140,0x104);
      kj::Exception::~Exception((Exception *)&nestedDecl._reader.capTable);
      bVar13 = (byte)nodeSet.node._reader.segment;
    }
    this_00 = &nodeSet.node._reader.capTable;
    if ((bVar13 & 1) != 0) {
      if ((this->guardedContent).bootstrapSchema.ptr.isSet == true) {
        (this->guardedContent).bootstrapSchema.ptr.isSet = false;
      }
      iVar15 = (*(this->module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[1])();
      if ((char)iVar15 == '\0') {
        kj::str<char_const(&)[60],kj::Exception&>
                  ((String *)&nestedDecl,
                   (kj *)"Internal compiler bug: Bootstrap schema failed validation:\n",
                   (char (*) [60])this_00,params_1);
        if (nestedDecl._reader.capTable == (CapTableReader *)0x0) {
          pcVar20 = "";
        }
        else {
          pcVar20 = (char *)CONCAT44(nestedDecl._reader.segment._4_4_,
                                     nestedDecl._reader.segment._0_4_);
        }
        pMVar6 = this->module->parserModule;
        (**(pMVar6->super_ErrorReporter)._vptr_ErrorReporter)
                  (pMVar6,(ulong)this->startByte,(ulong)this->endByte,pcVar20,
                   (long)&(nestedDecl._reader.capTable)->_vptr_CapTableReader +
                   (ulong)(nestedDecl._reader.capTable == (CapTableReader *)0x0));
        kj::String::~String((String *)&nestedDecl);
      }
    }
    if ((byte)nodeSet.node._reader.segment == '\x01') {
      kj::Exception::~Exception((Exception *)this_00);
    }
    ptr = (long *)kj::Arena::allocateBytes(pAVar26,0x10,8,true);
    *ptr = (long)pCVar1;
    *(undefined1 *)(ptr + 1) = 0;
    kj::Arena::setDestructor
              (pAVar26,ptr,
               kj::Arena::
               destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
              );
    pCVar1->state = BOOTSTRAP;
    if (local_318.segment != (SegmentBuilder *)0x0) {
      _::OrphanBuilder::euthanize(&local_318);
    }
  }
  if (2 < (int)minimumState) {
    NodeTranslator::finish(&nodeSet,(this->guardedContent).translator);
    if ((this->guardedContent).finalSchema.ptr.isSet == true) {
      (this->guardedContent).finalSchema.ptr.isSet = false;
    }
    *(StructDataBitCount *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x20) =
         nodeSet.node._reader.dataSize;
    *(undefined4 *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x24) =
         nodeSet.node._reader._36_4_;
    *(int *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x28) =
         nodeSet.node._reader.nestingLimit;
    *(undefined4 *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x2c) =
         nodeSet.node._reader._44_4_;
    *(undefined4 *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x10) =
         nodeSet.node._reader.data._0_4_;
    *(undefined4 *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x14) =
         nodeSet.node._reader.data._4_4_;
    *(ElementCount *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x18) =
         (ElementCount)nodeSet.node._reader.pointers;
    *(undefined4 *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x1c) =
         nodeSet.node._reader.pointers._4_4_;
    (this->guardedContent).finalSchema.ptr.field_1.value._reader.segment =
         nodeSet.node._reader.segment;
    (this->guardedContent).finalSchema.ptr.field_1.value._reader.capTable =
         nodeSet.node._reader.capTable;
    (this->guardedContent).finalSchema.ptr.isSet = true;
    pRVar25 = (this->guardedContent).auxSchemas.ptr;
    if (pRVar25 != (Reader *)0x0) {
      sVar22 = (this->guardedContent).auxSchemas.size_;
      (this->guardedContent).auxSchemas.ptr = (Reader *)0x0;
      (this->guardedContent).auxSchemas.size_ = 0;
      pAVar10 = (this->guardedContent).auxSchemas.disposer;
      (*(code *)**(undefined8 **)pAVar10)(pAVar10,pRVar25,0x30,sVar22,sVar22,0);
    }
    (this->guardedContent).auxSchemas.ptr = nodeSet.auxNodes.ptr;
    (this->guardedContent).auxSchemas.size_ = nodeSet.auxNodes.size_;
    (this->guardedContent).auxSchemas.disposer = nodeSet.auxNodes.disposer;
    nodeSet.auxNodes.ptr = (Reader *)0x0;
    nodeSet.auxNodes.size_ = 0;
    pRVar11 = (this->guardedContent).sourceInfo.ptr;
    if (pRVar11 == (Reader *)0x0) {
      pRVar25 = (Reader *)0x0;
    }
    else {
      sVar22 = (this->guardedContent).sourceInfo.size_;
      (this->guardedContent).sourceInfo.ptr = (Reader *)0x0;
      (this->guardedContent).sourceInfo.size_ = 0;
      pAVar10 = (this->guardedContent).sourceInfo.disposer;
      (*(code *)**(undefined8 **)pAVar10)(pAVar10,pRVar11,0x30,sVar22,sVar22,0);
      pRVar25 = nodeSet.auxNodes.ptr;
    }
    sVar22 = nodeSet.auxNodes.size_;
    (this->guardedContent).sourceInfo.ptr = nodeSet.sourceInfo.ptr;
    (this->guardedContent).sourceInfo.size_ = nodeSet.sourceInfo.size_;
    (this->guardedContent).sourceInfo.disposer = nodeSet.sourceInfo.disposer;
    nodeSet.sourceInfo.ptr = (Reader *)0x0;
    nodeSet.sourceInfo.size_ = 0;
    (this->guardedContent).state = FINISHED;
    if (pRVar25 != (Reader *)0x0) {
      nodeSet.auxNodes.ptr = (Reader *)0x0;
      nodeSet.auxNodes.size_ = 0;
      (*(code *)**(undefined8 **)nodeSet.auxNodes.disposer)
                (nodeSet.auxNodes.disposer,pRVar25,0x30,sVar22,sVar22,0);
    }
  }
LAB_00154fb1:
  this->inGetContent = false;
  return (Maybe<capnp::compiler::Compiler::Node::Content_&>)pCVar1;
}

Assistant:

kj::Maybe<Compiler::Node::Content&> Compiler::Node::getContent(Content::State minimumState) {
  KJ_REQUIRE(!isBuiltin, "illegal method call for built-in declaration");

  auto& content = guardedContent;

  if (content.stateHasReached(minimumState)) {
    return content;
  }

  if (inGetContent) {
    addError("Declaration recursively depends on itself.");
    return nullptr;
  }

  inGetContent = true;
  KJ_DEFER(inGetContent = false);

  switch (content.state) {
    case Content::STUB: {
      if (minimumState <= Content::STUB) break;

      // Expand the child nodes.
      auto& arena = module->getCompiler().getNodeArena();

      for (auto nestedDecl: declaration.getNestedDecls()) {
        switch (nestedDecl.which()) {
          case Declaration::FILE:
          case Declaration::CONST:
          case Declaration::ANNOTATION:
          case Declaration::ENUM:
          case Declaration::STRUCT:
          case Declaration::INTERFACE: {
            kj::Own<Node> subNode = arena.allocateOwn<Node>(*this, nestedDecl);
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.orderedNestedNodes.add(subNode);
            content.nestedNodes.insert(std::make_pair(name, kj::mv(subNode)));
            break;
          }

          case Declaration::USING: {
            kj::Own<Alias> alias = arena.allocateOwn<Alias>(
                *module, *this, nestedDecl.getUsing().getTarget());
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.aliases.insert(std::make_pair(name, kj::mv(alias)));
            break;
          }
          case Declaration::ENUMERANT:
          case Declaration::FIELD:
          case Declaration::UNION:
          case Declaration::GROUP:
          case Declaration::METHOD:
          case Declaration::NAKED_ID:
          case Declaration::NAKED_ANNOTATION:
            // Not a node.  Skip.
            break;
          default:
            KJ_FAIL_ASSERT("unknown declaration type", nestedDecl);
            break;
        }
      }

      content.advanceState(Content::EXPANDED);
    } // fallthrough

    case Content::EXPANDED: {
      if (minimumState <= Content::EXPANDED) break;

      // Construct the NodeTranslator.
      auto& workspace = module->getCompiler().getWorkspace();

      auto schemaNode = workspace.orphanage.newOrphan<schema::Node>();
      auto builder = schemaNode.get();
      builder.setId(id);
      builder.setDisplayName(displayName);
      // TODO(cleanup):  Would be better if we could remember the prefix length from before we
      //   added this decl's name to the end.
      KJ_IF_MAYBE(lastDot, displayName.findLast('.')) {
        builder.setDisplayNamePrefixLength(*lastDot + 1);
      }
      KJ_IF_MAYBE(lastColon, displayName.findLast(':')) {
        if (*lastColon > builder.getDisplayNamePrefixLength()) {
          builder.setDisplayNamePrefixLength(*lastColon + 1);
        }
      }
      KJ_IF_MAYBE(p, parent) {
        builder.setScopeId(p->id);
      }

      auto nestedNodes = builder.initNestedNodes(content.orderedNestedNodes.size());
      auto nestedIter = nestedNodes.begin();
      for (auto node: content.orderedNestedNodes) {
        nestedIter->setName(node->declaration.getName().getValue());
        nestedIter->setId(node->id);
        ++nestedIter;
      }

      content.translator = &workspace.arena.allocate<NodeTranslator>(
          *this, module->getErrorReporter(), declaration, kj::mv(schemaNode),
          module->getCompiler().shouldCompileAnnotations());
      KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&](){
        auto nodeSet = content.translator->getBootstrapNode();
        for (auto& auxNode: nodeSet.auxNodes) {
          workspace.bootstrapLoader.loadOnce(auxNode);
        }
        content.bootstrapSchema = workspace.bootstrapLoader.loadOnce(nodeSet.node);
      })) {
        content.bootstrapSchema = nullptr;
        // Only bother to report validation failures if we think we haven't seen any errors.
        // Otherwise we assume that the errors caused the validation failure.
        if (!module->getErrorReporter().hadErrors()) {
          addError(kj::str("Internal compiler bug: Bootstrap schema failed validation:\n",
                           *exception));
        }
      }

      // If the Workspace is destroyed, revert the node to the EXPANDED state, because the
      // NodeTranslator is no longer valid in this case.
      workspace.arena.copy(kj::defer([&content]() {
        content.bootstrapSchema = nullptr;
        if (content.state > Content::EXPANDED) {
          content.state = Content::EXPANDED;
        }
      }));

      content.advanceState(Content::BOOTSTRAP);
    } // fallthrough

    case Content::BOOTSTRAP: {
      if (minimumState <= Content::BOOTSTRAP) break;

      // Create the final schema.
      auto nodeSet = content.translator->finish();
      content.finalSchema = nodeSet.node;
      content.auxSchemas = kj::mv(nodeSet.auxNodes);
      content.sourceInfo = kj::mv(nodeSet.sourceInfo);

      content.advanceState(Content::FINISHED);
    } // fallthrough

    case Content::FINISHED:
      break;
  }

  return content;
}